

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O0

bool __thiscall GNUmakeTokenPoolPosix::AcquireToken(GNUmakeTokenPoolPosix *this)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  undefined1 local_219;
  undefined1 local_218 [7];
  char buf;
  itimerval timeout_1;
  undefined1 local_1f0 [4];
  int ret_1;
  sigaction old_act;
  sigaction act;
  int ret;
  fd_set *__arr;
  undefined1 local_a8 [4];
  uint __i;
  timeval timeout;
  fd_set set;
  GNUmakeTokenPoolPosix *this_local;
  
  memset(local_a8,0,0x10);
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    set.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
  }
  lVar3 = (long)(this->rfd_ / 0x40);
  set.fds_bits[lVar3 + -1] =
       1L << ((byte)((long)this->rfd_ % 0x40) & 0x3f) | set.fds_bits[lVar3 + -1];
  iVar1 = select(this->rfd_ + 1,(fd_set *)&timeout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                 (timeval *)local_a8);
  if ((0 < iVar1) && (dup_rfd_ = dup(this->rfd_), dup_rfd_ != -1)) {
    timeout_1.it_value.tv_usec._4_4_ = 0;
    memset(&old_act.sa_restorer,0,0x98);
    old_act.sa_restorer = CloseDupRfd;
    iVar1 = sigaction(0x11,(sigaction *)&old_act.sa_restorer,(sigaction *)local_1f0);
    if (iVar1 == 0) {
      memset(local_218,0,0x20);
      timeout_1.it_value.tv_sec = 100000;
      iVar1 = setitimer(ITIMER_REAL,(itimerval *)local_218,(itimerval *)0x0);
      if (iVar1 == 0) {
        sVar2 = read(dup_rfd_,&local_219,1);
        timeout_1.it_value.tv_usec._4_4_ = (int)sVar2;
        memset(local_218,0,0x20);
        setitimer(ITIMER_REAL,(itimerval *)local_218,(itimerval *)0x0);
      }
      sigaction(0x11,(sigaction *)local_1f0,(sigaction *)0x0);
    }
    CloseDupRfd(0);
    if (0 < timeout_1.it_value.tv_usec._4_4_) {
      return true;
    }
  }
  return false;
}

Assistant:

bool GNUmakeTokenPoolPosix::AcquireToken() {
  // Please read
  //
  //   http://make.mad-scientist.net/papers/jobserver-implementation/
  //
  // for the reasoning behind the following code.
  //
  // Try to read one character from the pipe. Returns true on success.
  //
  // First check if read() would succeed without blocking.
#ifdef USE_PPOLL
  pollfd pollfds[] = {{rfd_, POLLIN, 0}};
  int ret = poll(pollfds, 1, 0);
#else
  fd_set set;
  struct timeval timeout = { 0, 0 };
  FD_ZERO(&set);
  FD_SET(rfd_, &set);
  int ret = select(rfd_ + 1, &set, NULL, NULL, &timeout);
#endif
  if (ret > 0) {
    // Handle potential race condition:
    //  - the above check succeeded, i.e. read() should not block
    //  - the character disappears before we call read()
    //
    // Create a duplicate of rfd_. The duplicate file descriptor dup_rfd_
    // can safely be closed by signal handlers without affecting rfd_.
    dup_rfd_ = dup(rfd_);

    if (dup_rfd_ != -1) {
      struct sigaction act, old_act;
      int ret = 0;

      // Temporarily replace SIGCHLD handler with our own
      memset(&act, 0, sizeof(act));
      act.sa_handler = CloseDupRfd;
      if (sigaction(SIGCHLD, &act, &old_act) == 0) {
        struct itimerval timeout;

        // install a 100ms timeout that generates SIGALARM on expiration
        memset(&timeout, 0, sizeof(timeout));
        timeout.it_value.tv_usec = 100 * 1000; // [ms] -> [usec]
        if (setitimer(ITIMER_REAL, &timeout, NULL) == 0) {
          char buf;

          // Now try to read() from dup_rfd_. Return values from read():
          //
          // 1. token read                               ->  1
          // 2. pipe closed                              ->  0
          // 3. alarm expires                            -> -1 (EINTR)
          // 4. child exits                              -> -1 (EINTR)
          // 5. alarm expired before entering read()     -> -1 (EBADF)
          // 6. child exited before entering read()      -> -1 (EBADF)
          // 7. child exited before handler is installed -> go to 1 - 3
          ret = read(dup_rfd_, &buf, 1);

          // disarm timer
          memset(&timeout, 0, sizeof(timeout));
          setitimer(ITIMER_REAL, &timeout, NULL);
        }

        sigaction(SIGCHLD, &old_act, NULL);
      }

      CloseDupRfd(0);

      // Case 1 from above list
      if (ret > 0)
        return true;
    }
  }

  // read() would block, i.e. no token available,
  // cases 2-6 from above list or
  // select() / poll() / dup() / sigaction() / setitimer() failed
  return false;
}